

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

string * __thiscall cinatra::uri_t::get_path_abi_cxx11_(string *__return_storage_ptr__,uri_t *this)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  sVar1 = (this->path)._M_len;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "/";
    pcVar2 = "";
  }
  else {
    pcVar3 = (this->path)._M_str;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = pcVar3 + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string get_path() const {
    if (path.empty())
      return "/";

    return std::string(path);
  }